

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form1_ProjectionProfile(ProjectionProfileForm1 ProjectionProfile)

{
  uint uVar1;
  byte value;
  uint uVar2;
  int iVar3;
  _func_int **pp_Var4;
  ulong uVar5;
  _func_int **pp_Var6;
  long lVar7;
  bool bVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> projection;
  Image image;
  undefined1 local_70 [40];
  Image local_48;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)local_70,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_48,value,0,0,(ImageTemplate<unsigned_char> *)local_70);
  local_70._0_8_ = &PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_70);
  uVar2 = rand();
  (*ProjectionProfile)
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,&local_48,
             (uVar2 & 1) == 0);
  uVar1 = local_48._height;
  if ((uVar2 & 1) == 0) {
    uVar1 = local_48._width;
    local_48._width = local_48._height;
  }
  uVar5 = local_70._8_8_ - local_70._0_8_;
  if ((long)uVar5 >> 2 != (ulong)uVar1) {
    bVar8 = false;
    goto LAB_00155ba7;
  }
  iVar3 = local_48._width * value;
  pp_Var4 = (_func_int **)local_70._0_8_;
  if (0 < (long)uVar5 >> 4) {
    pp_Var4 = (_func_int **)((uVar5 & 0xfffffffffffffff0) + local_70._0_8_);
    lVar7 = ((long)uVar5 >> 4) + 1;
    pp_Var6 = (_func_int **)(local_70._0_8_ + 8);
    do {
      if (iVar3 != *(int *)(pp_Var6 + -1)) {
        pp_Var6 = pp_Var6 + -1;
        goto LAB_00155ba1;
      }
      if (iVar3 != *(int *)((long)pp_Var6 + -4)) {
        pp_Var6 = (_func_int **)((long)pp_Var6 + -4);
        goto LAB_00155ba1;
      }
      if (iVar3 != *(int *)pp_Var6) goto LAB_00155ba1;
      if (iVar3 != *(int *)((long)pp_Var6 + 4)) {
        pp_Var6 = (_func_int **)((long)pp_Var6 + 4);
        goto LAB_00155ba1;
      }
      lVar7 = lVar7 + -1;
      pp_Var6 = pp_Var6 + 2;
    } while (1 < lVar7);
  }
  lVar7 = local_70._8_8_ - (long)pp_Var4 >> 2;
  if (lVar7 == 1) {
LAB_00155b82:
    pp_Var6 = pp_Var4;
    if (iVar3 == *(int *)pp_Var4) {
      pp_Var6 = (_func_int **)local_70._8_8_;
    }
  }
  else if (lVar7 == 2) {
LAB_00155b7a:
    pp_Var6 = pp_Var4;
    if (iVar3 == *(int *)pp_Var4) {
      pp_Var4 = (_func_int **)((long)pp_Var4 + 4);
      goto LAB_00155b82;
    }
  }
  else {
    pp_Var6 = (_func_int **)local_70._8_8_;
    if ((lVar7 == 3) && (pp_Var6 = pp_Var4, iVar3 == *(int *)pp_Var4)) {
      pp_Var4 = (_func_int **)((long)pp_Var4 + 4);
      goto LAB_00155b7a;
    }
  }
LAB_00155ba1:
  bVar8 = pp_Var6 == (_func_int **)local_70._8_8_;
LAB_00155ba7:
  if ((_func_int **)local_70._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_70._0_8_);
  }
  local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
  return bVar8;
}

Assistant:

bool form1_ProjectionProfile(ProjectionProfileForm1 ProjectionProfile)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        const bool horizontal = (randomValue<int>(2) == 0);

        std::vector < uint32_t > projection = ProjectionProfile( image, horizontal );

        const uint32_t value = (horizontal ? image.height() : image.width()) * intensity;

        return projection.size() == (horizontal ? image.width() : image.height()) &&
            std::all_of( projection.begin(), projection.end(), [&value]( uint32_t v ) { return value == v; } );
    }